

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_port.h
# Opt level: O2

void __thiscall
sc_core::sc_port_b<sc_core::sc_event_queue_if>::make_sensitive
          (sc_port_b<sc_core::sc_event_queue_if> *this,sc_thread_handle handle_p,
          sc_event_finder *event_finder_)

{
  sc_event_queue_if *psVar1;
  sc_event *event;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  if ((this->super_sc_port_base).m_bind_info != (sc_bind_info *)0x0) {
    sc_port_base::make_sensitive(&this->super_sc_port_base,handle_p,event_finder_);
    return;
  }
  uVar3 = (ulong)((long)(this->m_interface_vec).
                        super__Vector_base<sc_core::sc_event_queue_if_*,_std::allocator<sc_core::sc_event_queue_if_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->m_interface_vec).
                       super__Vector_base<sc_core::sc_event_queue_if_*,_std::allocator<sc_core::sc_event_queue_if_*>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 3;
  uVar2 = 0;
  uVar4 = uVar3 & 0xffffffff;
  if ((int)uVar3 < 1) {
    uVar4 = uVar2;
  }
  while( true ) {
    if (uVar4 == uVar2) {
      return;
    }
    psVar1 = (this->m_interface_vec).
             super__Vector_base<sc_core::sc_event_queue_if_*,_std::allocator<sc_core::sc_event_queue_if_*>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar2];
    if (psVar1 == (sc_event_queue_if *)0x0) break;
    event = (sc_event *)
            (**(code **)(*(long *)((long)&psVar1->field_0x0 + *(long *)((long)*psVar1 + -0x30)) + 8)
            )((long)&psVar1->field_0x0 + *(long *)((long)*psVar1 + -0x30));
    sc_port_base::add_static_event(&this->super_sc_port_base,handle_p,event);
    uVar2 = uVar2 + 1;
  }
  sc_assertion_failed("iface_p != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/communication/sc_port.h"
                      ,0x259);
}

Assistant:

void
sc_port_b<IF>::make_sensitive( sc_thread_handle handle_p,
                  sc_event_finder* event_finder_ ) const
{
    if ( m_bind_info == 0 )
    {
        int if_n = size();
        for ( int if_i = 0; if_i < if_n; if_i++ )
	{
	    IF* iface_p = m_interface_vec[if_i];
	    sc_assert( iface_p != 0 );
	    add_static_event( handle_p, iface_p->default_event() );
	}
    }
    else
    {
        sc_port_base::make_sensitive( handle_p, event_finder_ );
    }
}